

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::csharp::MessageGenerator::GenerateFrameworkMethods
          (MessageGenerator *this,Printer *printer)

{
  mapped_type *this_00;
  FieldGeneratorBase *pFVar1;
  Descriptor *pDVar2;
  int i_1;
  long lVar3;
  int i;
  long lVar4;
  allocator local_a1;
  scoped_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase> generator;
  key_type local_80;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &vars._M_t._M_impl.super__Rb_tree_header._M_header;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  vars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  class_name_abi_cxx11_((string *)&generator,this);
  std::__cxx11::string::string((string *)&local_80,"class_name",&local_a1);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&vars,&local_80);
  std::__cxx11::string::operator=((string *)this_00,(string *)&generator);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&generator);
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
  io::Printer::Print(printer,&vars,
                     "public override bool Equals(object other) {\n  return Equals(other as $class_name$);\n}\n\n"
                    );
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
  io::Printer::Print(printer,&vars,
                     "public bool Equals($class_name$ other) {\n  if (ReferenceEquals(other, null)) {\n    return false;\n  }\n  if (ReferenceEquals(other, this)) {\n    return true;\n  }\n"
                    );
  io::Printer::Indent(printer);
  lVar3 = 0;
  for (lVar4 = 0; pDVar2 = this->descriptor_, lVar4 < *(int *)(pDVar2 + 0x2c); lVar4 = lVar4 + 1) {
    generator.ptr_ =
         CreateFieldGeneratorInternal(this,(FieldDescriptor *)(*(long *)(pDVar2 + 0x30) + lVar3));
    pFVar1 = internal::scoped_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase>::
             operator->(&generator);
    (*(pFVar1->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[0xb])(pFVar1,printer);
    if (generator.ptr_ != (FieldGeneratorBase *)0x0) {
      (*((generator.ptr_)->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[1])();
    }
    lVar3 = lVar3 + 0xa8;
  }
  lVar3 = 0;
  for (lVar4 = 0; lVar4 < *(int *)(pDVar2 + 0x38); lVar4 = lVar4 + 1) {
    UnderscoresToCamelCase((string *)&generator,*(string **)(*(long *)(pDVar2 + 0x40) + lVar3),true)
    ;
    io::Printer::Print(printer,
                       "if ($property_name$Case != other.$property_name$Case) return false;\n",
                       "property_name",(string *)&generator);
    std::__cxx11::string::~string((string *)&generator);
    pDVar2 = this->descriptor_;
    lVar3 = lVar3 + 0x30;
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"  return true;\n}\n\n");
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
  io::Printer::Print(printer,"public override int GetHashCode() {\n  int hash = 1;\n");
  io::Printer::Indent(printer);
  lVar3 = 0;
  for (lVar4 = 0; pDVar2 = this->descriptor_, lVar4 < *(int *)(pDVar2 + 0x2c); lVar4 = lVar4 + 1) {
    generator.ptr_ =
         CreateFieldGeneratorInternal(this,(FieldDescriptor *)(*(long *)(pDVar2 + 0x30) + lVar3));
    pFVar1 = internal::scoped_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase>::
             operator->(&generator);
    (*(pFVar1->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[10])(pFVar1,printer);
    if (generator.ptr_ != (FieldGeneratorBase *)0x0) {
      (*((generator.ptr_)->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[1])();
    }
    lVar3 = lVar3 + 0xa8;
  }
  lVar3 = 0;
  for (lVar4 = 0; lVar4 < *(int *)(pDVar2 + 0x38); lVar4 = lVar4 + 1) {
    UnderscoresToCamelCase
              ((string *)&generator,*(string **)(*(long *)(pDVar2 + 0x40) + lVar3),false);
    io::Printer::Print(printer,"hash ^= (int) $name$Case_;\n","name",(string *)&generator);
    std::__cxx11::string::~string((string *)&generator);
    pDVar2 = this->descriptor_;
    lVar3 = lVar3 + 0x30;
  }
  io::Printer::Print(printer,"return hash;\n");
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n\n");
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
  io::Printer::Print(printer,
                     "public override string ToString() {\n  return pb::JsonFormatter.ToDiagnosticString(this);\n}\n\n"
                    );
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&vars._M_t);
  return;
}

Assistant:

void MessageGenerator::GenerateFrameworkMethods(io::Printer* printer) {
    map<string, string> vars;
    vars["class_name"] = class_name();

    // Equality
	WriteGeneratedCodeAttributes(printer);
    printer->Print(
        vars,
        "public override bool Equals(object other) {\n"
        "  return Equals(other as $class_name$);\n"
        "}\n\n");
	WriteGeneratedCodeAttributes(printer);
	printer->Print(
	    vars,
        "public bool Equals($class_name$ other) {\n"
        "  if (ReferenceEquals(other, null)) {\n"
        "    return false;\n"
        "  }\n"
        "  if (ReferenceEquals(other, this)) {\n"
        "    return true;\n"
        "  }\n");
    printer->Indent();
    for (int i = 0; i < descriptor_->field_count(); i++) {
        scoped_ptr<FieldGeneratorBase> generator(
            CreateFieldGeneratorInternal(descriptor_->field(i)));
        generator->WriteEquals(printer);
    }
    for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
        printer->Print("if ($property_name$Case != other.$property_name$Case) return false;\n",
            "property_name", UnderscoresToCamelCase(descriptor_->oneof_decl(i)->name(), true));
    }
    printer->Outdent();
    printer->Print(
        "  return true;\n"
        "}\n\n");

    // GetHashCode
    // Start with a non-zero value to easily distinguish between null and "empty" messages.
	WriteGeneratedCodeAttributes(printer);
	printer->Print(
        "public override int GetHashCode() {\n"
        "  int hash = 1;\n");
    printer->Indent();
    for (int i = 0; i < descriptor_->field_count(); i++) {
        scoped_ptr<FieldGeneratorBase> generator(
            CreateFieldGeneratorInternal(descriptor_->field(i)));
        generator->WriteHash(printer);
    }
    for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
        printer->Print("hash ^= (int) $name$Case_;\n",
            "name", UnderscoresToCamelCase(descriptor_->oneof_decl(i)->name(), false));
    }
    printer->Print("return hash;\n");
    printer->Outdent();
    printer->Print("}\n\n");

	WriteGeneratedCodeAttributes(printer);
	printer->Print(
        "public override string ToString() {\n"
        "  return pb::JsonFormatter.ToDiagnosticString(this);\n"
        "}\n\n");
}